

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNValidatorTests.cpp
# Opt level: O0

int testInnerProductDynamicQuantizationConversionParameterValidation(void)

{
  bool bVar1;
  NeuralNetwork *this;
  ModelDescription *pMVar2;
  FeatureDescription *pFVar3;
  FeatureType *pFVar4;
  ArrayFeatureType *this_00;
  NeuralNetworkLayer *this_01;
  InnerProductLayerParams *this_02;
  QuantizationParams *pQVar5;
  LinearQuantizationParams *pLVar6;
  ostream *poVar7;
  LookUpTableQuantizationParams *this_03;
  Result local_1d8;
  int local_1ac;
  int i;
  Result local_180;
  Result local_158;
  Result local_130;
  Result local_108;
  Result local_e0;
  undefined4 local_b4;
  undefined1 local_b0 [8];
  Result res;
  WeightParams *weights;
  InnerProductLayerParams *inner_product_params;
  NeuralNetworkLayer *layer1;
  FeatureDescription *out;
  ArrayFeatureType *shape;
  FeatureDescription *topIn;
  NeuralNetwork *nnWrite;
  Model m1;
  
  CoreML::Specification::Model::Model((Model *)&nnWrite);
  this = CoreML::Specification::Model::mutable_neuralnetwork((Model *)&nnWrite);
  CoreML::Specification::NeuralNetwork::set_arrayinputshapemapping(this,EXACT_ARRAY_MAPPING);
  pMVar2 = CoreML::Specification::Model::mutable_description((Model *)&nnWrite);
  pFVar3 = CoreML::Specification::ModelDescription::add_input(pMVar2);
  CoreML::Specification::FeatureDescription::set_name(pFVar3,"A");
  pFVar4 = CoreML::Specification::FeatureDescription::mutable_type(pFVar3);
  CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar4);
  pFVar4 = CoreML::Specification::FeatureDescription::mutable_type(pFVar3);
  this_00 = CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar4);
  CoreML::Specification::ArrayFeatureType::add_shape(this_00,1);
  pMVar2 = CoreML::Specification::Model::mutable_description((Model *)&nnWrite);
  pFVar3 = CoreML::Specification::ModelDescription::add_output(pMVar2);
  CoreML::Specification::FeatureDescription::set_name(pFVar3,"B");
  pFVar4 = CoreML::Specification::FeatureDescription::mutable_type(pFVar3);
  CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar4);
  this_01 = CoreML::Specification::NeuralNetwork::add_layers(this);
  CoreML::Specification::NeuralNetworkLayer::set_name(this_01,"inner_product");
  CoreML::Specification::NeuralNetworkLayer::add_input(this_01,"A");
  CoreML::Specification::NeuralNetworkLayer::add_output(this_01,"B");
  this_02 = CoreML::Specification::NeuralNetworkLayer::mutable_innerproduct(this_01);
  CoreML::Specification::InnerProductLayerParams::set_inputchannels(this_02,4);
  CoreML::Specification::InnerProductLayerParams::set_outputchannels(this_02,2);
  CoreML::Specification::InnerProductLayerParams::set_hasbias(this_02,false);
  CoreML::Specification::InnerProductLayerParams::set_int8dynamicquantize(this_02,true);
  res.m_message.field_2._8_8_ =
       CoreML::Specification::InnerProductLayerParams::mutable_weights(this_02);
  CoreML::Specification::WeightParams::set_int8rawvalue
            ((WeightParams *)res.m_message.field_2._8_8_,"11111111");
  pQVar5 = CoreML::Specification::WeightParams::mutable_quantization
                     ((WeightParams *)res.m_message.field_2._8_8_);
  CoreML::Specification::QuantizationParams::set_numberofbits(pQVar5,8);
  pQVar5 = CoreML::Specification::WeightParams::mutable_quantization
                     ((WeightParams *)res.m_message.field_2._8_8_);
  pLVar6 = CoreML::Specification::QuantizationParams::mutable_linearquantization(pQVar5);
  CoreML::Specification::LinearQuantizationParams::add_scale(pLVar6,4.0);
  CoreML::validate<(MLModelType)500>((Result *)local_b0,(Model *)&nnWrite);
  bVar1 = CoreML::Result::good((Result *)local_b0);
  if (bVar1) {
    CoreML::Specification::InnerProductLayerParams::set_hasbias(this_02,true);
    CoreML::validate<(MLModelType)500>(&local_e0,(Model *)&nnWrite);
    CoreML::Result::operator=((Result *)local_b0,&local_e0);
    CoreML::Result::~Result(&local_e0);
    bVar1 = CoreML::Result::good((Result *)local_b0);
    if (bVar1) {
      CoreML::Specification::InnerProductLayerParams::set_hasbias(this_02,false);
      pQVar5 = CoreML::Specification::WeightParams::mutable_quantization
                         ((WeightParams *)res.m_message.field_2._8_8_);
      pLVar6 = CoreML::Specification::QuantizationParams::mutable_linearquantization(pQVar5);
      CoreML::Specification::LinearQuantizationParams::add_bias(pLVar6,1.0);
      CoreML::validate<(MLModelType)500>(&local_108,(Model *)&nnWrite);
      CoreML::Result::operator=((Result *)local_b0,&local_108);
      CoreML::Result::~Result(&local_108);
      bVar1 = CoreML::Result::good((Result *)local_b0);
      if (bVar1) {
        poVar7 = std::operator<<((ostream *)&std::cout,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                                );
        poVar7 = std::operator<<(poVar7,":");
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x283);
        poVar7 = std::operator<<(poVar7,": error: ");
        poVar7 = std::operator<<(poVar7,"!((res).good())");
        poVar7 = std::operator<<(poVar7," was false, expected true.");
        std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
        m1._oneof_case_[0] = 1;
      }
      else {
        pQVar5 = CoreML::Specification::WeightParams::mutable_quantization
                           ((WeightParams *)res.m_message.field_2._8_8_);
        pLVar6 = CoreML::Specification::QuantizationParams::mutable_linearquantization(pQVar5);
        CoreML::Specification::LinearQuantizationParams::clear_bias(pLVar6);
        pQVar5 = CoreML::Specification::WeightParams::mutable_quantization
                           ((WeightParams *)res.m_message.field_2._8_8_);
        CoreML::Specification::QuantizationParams::set_numberofbits(pQVar5,7);
        CoreML::validate<(MLModelType)500>(&local_130,(Model *)&nnWrite);
        CoreML::Result::operator=((Result *)local_b0,&local_130);
        CoreML::Result::~Result(&local_130);
        bVar1 = CoreML::Result::good((Result *)local_b0);
        if (bVar1) {
          poVar7 = std::operator<<((ostream *)&std::cout,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                                  );
          poVar7 = std::operator<<(poVar7,":");
          poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x289);
          poVar7 = std::operator<<(poVar7,": error: ");
          poVar7 = std::operator<<(poVar7,"!((res).good())");
          poVar7 = std::operator<<(poVar7," was false, expected true.");
          std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
          m1._oneof_case_[0] = 1;
        }
        else {
          pQVar5 = CoreML::Specification::WeightParams::mutable_quantization
                             ((WeightParams *)res.m_message.field_2._8_8_);
          CoreML::Specification::QuantizationParams::set_numberofbits(pQVar5,8);
          pQVar5 = CoreML::Specification::WeightParams::mutable_quantization
                             ((WeightParams *)res.m_message.field_2._8_8_);
          this_03 = CoreML::Specification::QuantizationParams::mutable_lookuptablequantization
                              (pQVar5);
          CoreML::Specification::LookUpTableQuantizationParams::add_floatvalue(this_03,1.0);
          CoreML::validate<(MLModelType)500>(&local_158,(Model *)&nnWrite);
          CoreML::Result::operator=((Result *)local_b0,&local_158);
          CoreML::Result::~Result(&local_158);
          bVar1 = CoreML::Result::good((Result *)local_b0);
          if (bVar1) {
            poVar7 = std::operator<<((ostream *)&std::cout,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                                    );
            poVar7 = std::operator<<(poVar7,":");
            poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x28f);
            poVar7 = std::operator<<(poVar7,": error: ");
            poVar7 = std::operator<<(poVar7,"!((res).good())");
            poVar7 = std::operator<<(poVar7," was false, expected true.");
            std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
            m1._oneof_case_[0] = 1;
          }
          else {
            pQVar5 = CoreML::Specification::WeightParams::mutable_quantization
                               ((WeightParams *)res.m_message.field_2._8_8_);
            pLVar6 = CoreML::Specification::QuantizationParams::mutable_linearquantization(pQVar5);
            CoreML::Specification::LinearQuantizationParams::add_scale(pLVar6,4.0);
            CoreML::Specification::WeightParams::clear_int8rawvalue
                      ((WeightParams *)res.m_message.field_2._8_8_);
            CoreML::Specification::WeightParams::set_rawvalue
                      ((WeightParams *)res.m_message.field_2._8_8_,"11111111");
            CoreML::validate<(MLModelType)500>(&local_180,(Model *)&nnWrite);
            CoreML::Result::operator=((Result *)local_b0,&local_180);
            CoreML::Result::~Result(&local_180);
            bVar1 = CoreML::Result::good((Result *)local_b0);
            if (bVar1) {
              poVar7 = std::operator<<((ostream *)&std::cout,
                                       "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                                      );
              poVar7 = std::operator<<(poVar7,":");
              poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x296);
              poVar7 = std::operator<<(poVar7,": error: ");
              poVar7 = std::operator<<(poVar7,"!((res).good())");
              poVar7 = std::operator<<(poVar7," was false, expected true.");
              std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
              m1._oneof_case_[0] = 1;
            }
            else {
              CoreML::Specification::WeightParams::clear_rawvalue
                        ((WeightParams *)res.m_message.field_2._8_8_);
              CoreML::Specification::WeightParams::set_float16value
                        ((WeightParams *)res.m_message.field_2._8_8_,"0101010101010101");
              CoreML::validate<(MLModelType)500>
                        ((Result *)&stack0xfffffffffffffe58,(Model *)&nnWrite);
              CoreML::Result::operator=((Result *)local_b0,(Result *)&stack0xfffffffffffffe58);
              CoreML::Result::~Result((Result *)&stack0xfffffffffffffe58);
              bVar1 = CoreML::Result::good((Result *)local_b0);
              if (bVar1) {
                poVar7 = std::operator<<((ostream *)&std::cout,
                                         "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                                        );
                poVar7 = std::operator<<(poVar7,":");
                poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x29c);
                poVar7 = std::operator<<(poVar7,": error: ");
                poVar7 = std::operator<<(poVar7,"!((res).good())");
                poVar7 = std::operator<<(poVar7," was false, expected true.");
                std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
                m1._oneof_case_[0] = 1;
              }
              else {
                CoreML::Specification::WeightParams::clear_float16value
                          ((WeightParams *)res.m_message.field_2._8_8_);
                for (local_1ac = 0; local_1ac < 8; local_1ac = local_1ac + 1) {
                  CoreML::Specification::WeightParams::add_floatvalue
                            ((WeightParams *)res.m_message.field_2._8_8_,1.0);
                }
                CoreML::validate<(MLModelType)500>(&local_1d8,(Model *)&nnWrite);
                CoreML::Result::operator=((Result *)local_b0,&local_1d8);
                CoreML::Result::~Result(&local_1d8);
                bVar1 = CoreML::Result::good((Result *)local_b0);
                if (bVar1) {
                  poVar7 = std::operator<<((ostream *)&std::cout,
                                           "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                                          );
                  poVar7 = std::operator<<(poVar7,":");
                  poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x2a4);
                  poVar7 = std::operator<<(poVar7,": error: ");
                  poVar7 = std::operator<<(poVar7,"!((res).good())");
                  poVar7 = std::operator<<(poVar7," was false, expected true.");
                  std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
                  m1._oneof_case_[0] = 1;
                }
                else {
                  CoreML::Specification::WeightParams::clear_floatvalue
                            ((WeightParams *)res.m_message.field_2._8_8_);
                  m1._oneof_case_[0] = 0;
                }
              }
            }
          }
        }
      }
    }
    else {
      poVar7 = std::operator<<((ostream *)&std::cout,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                              );
      poVar7 = std::operator<<(poVar7,":");
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x27d);
      poVar7 = std::operator<<(poVar7,": error: ");
      poVar7 = std::operator<<(poVar7,"(res).good()");
      poVar7 = std::operator<<(poVar7," was false, expected true.");
      std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
      m1._oneof_case_[0] = 1;
    }
  }
  else {
    poVar7 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                            );
    poVar7 = std::operator<<(poVar7,":");
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x278);
    poVar7 = std::operator<<(poVar7,": error: ");
    poVar7 = std::operator<<(poVar7,"(res).good()");
    poVar7 = std::operator<<(poVar7," was false, expected true.");
    std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
    m1._oneof_case_[0] = 1;
  }
  local_b4 = 1;
  CoreML::Result::~Result((Result *)local_b0);
  CoreML::Specification::Model::~Model((Model *)&nnWrite);
  return m1._oneof_case_[0];
}

Assistant:

int testInnerProductDynamicQuantizationConversionParameterValidation() {

    // Setup
    Specification::Model m1;
    Specification::NeuralNetwork *nnWrite = m1.mutable_neuralnetwork();
    nnWrite->set_arrayinputshapemapping(Specification::EXACT_ARRAY_MAPPING);

    auto *topIn = m1.mutable_description()->add_input();
    topIn->set_name("A");
    topIn->mutable_type()->mutable_multiarraytype();
    auto *shape = topIn->mutable_type()->mutable_multiarraytype();
    shape->add_shape(1);

    auto *out = m1.mutable_description()->add_output();
    out->set_name("B");
    out->mutable_type()->mutable_multiarraytype();

    Specification::NeuralNetworkLayer* layer1 = nnWrite->add_layers();
    layer1->set_name("inner_product");
    layer1->add_input("A");
    layer1->add_output("B");
    Specification::InnerProductLayerParams* inner_product_params = layer1->mutable_innerproduct();
    inner_product_params->set_inputchannels(4);
    inner_product_params->set_outputchannels(2);
    inner_product_params->set_hasbias(false);
    inner_product_params->set_int8dynamicquantize(true);

    auto* weights = inner_product_params->mutable_weights();
    weights->set_int8rawvalue("11111111");
    weights->mutable_quantization()->set_numberofbits(8);
    weights->mutable_quantization()->mutable_linearquantization()->add_scale(4);

    // Setup: Correct model
    Result res = validate<MLModelType_neuralNetwork>(m1);
    ML_ASSERT_GOOD(res);

    // Case 1: has bias
    inner_product_params->set_hasbias(true);
    res = validate<MLModelType_neuralNetwork>(m1);
    ML_ASSERT_GOOD(res);
    inner_product_params->set_hasbias(false);

    // Case 2: Non empty linear quantization bias
    weights->mutable_quantization()->mutable_linearquantization()->add_bias(1);
    res = validate<MLModelType_neuralNetwork>(m1);
    ML_ASSERT_BAD(res);
    weights->mutable_quantization()->mutable_linearquantization()->clear_bias();

    // Case 3: numberofbits != 8
    weights->mutable_quantization()->set_numberofbits(7);
    res = validate<MLModelType_neuralNetwork>(m1);
    ML_ASSERT_BAD(res);
    weights->mutable_quantization()->set_numberofbits(8);

    // Case 4: Lookup table mode is on
    weights->mutable_quantization()->mutable_lookuptablequantization()->add_floatvalue(1);
    res = validate<MLModelType_neuralNetwork>(m1);
    ML_ASSERT_BAD(res);
    weights->mutable_quantization()->mutable_linearquantization()->add_scale(4);

    // Case 5: uint8 weights
    weights->clear_int8rawvalue();
    weights->set_rawvalue("11111111");
    res = validate<MLModelType_neuralNetwork>(m1);
    ML_ASSERT_BAD(res);
    weights->clear_rawvalue();

    // Case 6: float16 weights
    weights->set_float16value("0101010101010101");
    res = validate<MLModelType_neuralNetwork>(m1);
    ML_ASSERT_BAD(res);
    weights->clear_float16value();

    // Case 7: float weights
    for (int i = 0; i < 8; ++i){
        weights->add_floatvalue(1);
    }
    res = validate<MLModelType_neuralNetwork>(m1);
    ML_ASSERT_BAD(res);
    weights->clear_floatvalue();

    return 0;
}